

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.cpp
# Opt level: O1

int __thiscall chrono::ChLinkMask::GetMaskDoc(ChLinkMask *this)

{
  int iVar1;
  long lVar2;
  
  if (0 < (long)this->nconstr) {
    lVar2 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + (uint)((this->constraints).
                             super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar2]->super_ChConstraintTwo
                            ).super_ChConstraint.active;
      lVar2 = lVar2 + 1;
    } while (this->nconstr != lVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int ChLinkMask::GetMaskDoc() {
    int tot = 0;
    for (int j = 0; j < nconstr; j++) {
        if (Constr_N(j).IsActive())
            tot++;
    }
    return tot;
}